

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::setUpMaps
          (StateDescriptor *this,int *use_default_map,InterpBase *default_map,int start_comp,
          int num_comp,InterpBase ***maps,int *nmaps,int **map_start_comp,int **map_num_comp,
          int **max_start_comp,int **min_end_comp)

{
  InterpBase *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  InterpBase **ppIVar7;
  ulong uVar8;
  void *pvVar9;
  _func_int **pp_Var10;
  int *piVar11;
  int in_ECX;
  InterpBase *in_RDX;
  int *in_RSI;
  int in_R8D;
  long *in_R9;
  int *in_stack_00000008;
  long *in_stack_00000010;
  InterpBase *mapper_icomp_1;
  long *in_stack_00000020;
  int imap;
  InterpBase *mapper_icomp;
  int icomp;
  InterpBase *map;
  int *in_stack_ffffffffffffff98;
  Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_> *in_stack_ffffffffffffffa0;
  InterpBase *local_50;
  int local_44;
  InterpBase *local_40;
  int local_34;
  InterpBase *local_30;
  
  *in_R9 = 0;
  *in_stack_00000010 = 0;
  mapper_icomp_1->_vptr_InterpBase = (_func_int **)0x0;
  *in_stack_00000020 = 0;
  mapper_icomp->_vptr_InterpBase = (_func_int **)0x0;
  ppIVar7 = Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::operator[]
                      (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  local_30 = *ppIVar7;
  if (local_30 == (InterpBase *)0x0) {
    local_30 = in_RDX;
  }
  *in_stack_00000008 = 1;
  *in_RSI = 1;
  for (local_34 = in_ECX + 1; local_34 < in_ECX + in_R8D; local_34 = local_34 + 1) {
    ppIVar7 = Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::operator[]
                        (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    pIVar1 = *ppIVar7;
    local_40 = in_RDX;
    if (pIVar1 != (InterpBase *)0x0) {
      *in_RSI = 0;
      local_40 = pIVar1;
    }
    if (local_30 != local_40) {
      local_30 = local_40;
      *in_stack_00000008 = *in_stack_00000008 + 1;
    }
  }
  if (*in_RSI == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*in_stack_00000008;
    uVar8 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar8);
    *in_R9 = (long)pvVar9;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)*in_stack_00000008;
    uVar8 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar8);
    *in_stack_00000010 = (long)pvVar9;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)*in_stack_00000008;
    uVar8 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pp_Var10 = (_func_int **)operator_new__(uVar8);
    mapper_icomp_1->_vptr_InterpBase = pp_Var10;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)*in_stack_00000008;
    uVar8 = SUB168(auVar5 * ZEXT816(4),0);
    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pp_Var10 = (_func_int **)operator_new__(uVar8);
    mapper_icomp->_vptr_InterpBase = pp_Var10;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)*in_stack_00000008;
    uVar8 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar8);
    *in_stack_00000020 = (long)pvVar9;
    local_44 = 0;
    ppIVar7 = Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::operator[]
                        (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    if (*ppIVar7 == (InterpBase *)0x0) {
      *(InterpBase **)*in_R9 = in_RDX;
    }
    else {
      ppIVar7 = Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::operator[]
                          (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      *(InterpBase **)*in_R9 = *ppIVar7;
    }
    *(int *)*in_stack_00000010 = in_ECX;
    *(undefined4 *)mapper_icomp_1->_vptr_InterpBase = 1;
    piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                         (size_type)in_stack_ffffffffffffff98);
    *(int *)mapper_icomp->_vptr_InterpBase = *piVar11;
    piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                         (size_type)in_stack_ffffffffffffff98);
    *(int *)*in_stack_00000020 = *piVar11;
    for (local_34 = in_ECX + 1; local_34 < in_ECX + in_R8D; local_34 = local_34 + 1) {
      ppIVar7 = Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::operator[]
                          (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      local_50 = *ppIVar7;
      if (local_50 == (InterpBase *)0x0) {
        local_50 = in_RDX;
      }
      if (*(InterpBase **)(*in_R9 + (long)local_44 * 8) == local_50) {
        *(int *)((long)mapper_icomp_1->_vptr_InterpBase + (long)local_44 * 4) =
             *(int *)((long)mapper_icomp_1->_vptr_InterpBase + (long)local_44 * 4) + 1;
        in_stack_ffffffffffffff98 =
             (int *)((long)mapper_icomp->_vptr_InterpBase + (long)local_44 * 4);
        piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                             (size_type)in_stack_ffffffffffffff98);
        piVar11 = std::max<int>(in_stack_ffffffffffffff98,piVar11);
        *(int *)((long)mapper_icomp->_vptr_InterpBase + (long)local_44 * 4) = *piVar11;
        in_stack_ffffffffffffffa0 =
             (Vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_> *)
             (*in_stack_00000020 + (long)local_44 * 4);
        piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                             (size_type)in_stack_ffffffffffffff98);
        piVar11 = std::min<int>((int *)in_stack_ffffffffffffffa0,piVar11);
        *(int *)(*in_stack_00000020 + (long)local_44 * 4) = *piVar11;
      }
      else {
        local_44 = local_44 + 1;
        *(InterpBase **)(*in_R9 + (long)local_44 * 8) = local_50;
        *(int *)(*in_stack_00000010 + (long)local_44 * 4) = local_34;
        *(undefined4 *)((long)mapper_icomp_1->_vptr_InterpBase + (long)local_44 * 4) = 1;
        piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                             (size_type)in_stack_ffffffffffffff98);
        *(int *)((long)mapper_icomp->_vptr_InterpBase + (long)local_44 * 4) = *piVar11;
        piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                             (size_type)in_stack_ffffffffffffff98);
        *(int *)(*in_stack_00000020 + (long)local_44 * 4) = *piVar11;
      }
    }
  }
  return;
}

Assistant:

void
StateDescriptor::setUpMaps (int&                use_default_map,
                            const InterpBase*   default_map,
                            int                 start_comp,
                            int                 num_comp,
                            InterpBase**&       maps,
                            int&                nmaps,
                            int*&               map_start_comp,
                            int*&               map_num_comp,
                            int*&               max_start_comp,
                            int*&               min_end_comp) const
{
    BL_ASSERT(start_comp>=0 && start_comp+num_comp-1 < ncomp && num_comp>0);

    maps           = 0;
    map_start_comp = 0;
    map_num_comp   = 0;
    max_start_comp = 0;
    min_end_comp   = 0;
    //
    // First, count number of interpolaters needed and allocate.
    //
    InterpBase* map = mapper_comp[start_comp];
    if (!map) map = (InterpBase*) default_map;
    nmaps = 1;
    int icomp = start_comp+1;

    use_default_map = 1;
    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];
        if (!mapper_icomp)
        {
            mapper_icomp = (InterpBase *) default_map;
        }
        else
        {
            use_default_map = 0;
        }
        if (map != mapper_icomp)
        {
            map = mapper_icomp;
            nmaps++;
        }
        icomp++;
    }

    if (use_default_map) return;

    maps           = new InterpBase*[nmaps];
    map_start_comp = new int[nmaps];
    map_num_comp   = new int[nmaps];
    min_end_comp   = new int[nmaps];
    max_start_comp = new int[nmaps];
    //
    // Now fill the slots.
    //
    int imap             = 0;

    if (mapper_comp[start_comp])
    {
        maps[imap] = mapper_comp[start_comp];
    }
    else
    {
        maps[imap] = (InterpBase *) default_map;
    }

    icomp                = start_comp+1;
    map_start_comp[imap] = start_comp;
    map_num_comp[imap]   = 1;
    min_end_comp[imap]   = min_map_end_comp[start_comp];
    max_start_comp[imap] = max_map_start_comp[start_comp];

    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];

        if (!mapper_icomp)
            mapper_icomp = (InterpBase *) default_map;

        if (maps[imap] != mapper_icomp)
        {
            imap++;

            BL_ASSERT (imap < nmaps);

            maps[imap]           = mapper_icomp;
            map_start_comp[imap] = icomp;
            map_num_comp[imap]   = 1;
            min_end_comp[imap]   = min_map_end_comp[icomp];
            max_start_comp[imap] = max_map_start_comp[icomp];

        }
        else
        {
            map_num_comp[imap]++;
            min_end_comp[imap]   = std::max(min_end_comp[imap],min_map_end_comp[icomp]);
            max_start_comp[imap] = std::min(max_start_comp[imap],max_map_start_comp[icomp]);
        }
        icomp++;
    }
}